

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

bool __thiscall
moira::Moira::execDivlMusashi<(moira::Core)2,(moira::Instr)154,(moira::Mode)9,4>
          (Moira *this,u16 opcode,bool *divByZero)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  u32 uVar6;
  int iVar7;
  ulong uVar8;
  pair<unsigned_int,_unsigned_int> pVar9;
  ulong uVar10;
  u32 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar1 = (this->queue).irc;
  uVar11 = (this->reg).pc + 2;
  (this->reg).pc = uVar11;
  uVar11 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar11);
  (this->queue).irc = (u16)uVar11;
  this->readBuffer = (u16)uVar11;
  uVar11 = computeEA<(moira::Core)2,(moira::Mode)9,4,0ull>(this,opcode & 7);
  uVar11 = read<(moira::Core)2,(moira::AddrSpace)2,4,0ull>(this,uVar11);
  if (uVar11 == 0) {
    execException<(moira::Core)2>(this,DIVIDE_BY_ZERO,0);
    *divByZero = true;
    return false;
  }
  uVar14 = (ulong)(uVar1 & 7);
  uVar13 = (ulong)(uVar1 >> 0xc & 7);
  uVar6 = (this->reg).pc;
  (this->reg).pc0 = uVar6;
  (this->queue).ird = (this->queue).irc;
  uVar6 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar6 + 2);
  (this->queue).irc = (u16)uVar6;
  this->readBuffer = (u16)uVar6;
  switch(uVar1 >> 10 & 3) {
  case 0:
    uVar2 = *(uint *)((long)&(this->reg).field_3 + uVar13 * 4);
    (this->reg).sr.n = SUB81((ulong)uVar2 / (ulong)uVar11 >> 0x1f,0);
    (this->reg).sr.z = uVar2 < uVar11;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    *(uint *)((long)&(this->reg).field_3 + uVar14 * 4) = uVar2 % uVar11;
    *(int *)((long)&(this->reg).field_3 + uVar13 * 4) = (int)((ulong)uVar2 / (ulong)uVar11);
    break;
  case 1:
    uVar10 = CONCAT44(*(undefined4 *)((long)&(this->reg).field_3 + uVar14 * 4),
                      *(undefined4 *)((long)&(this->reg).field_3 + uVar13 * 4));
    uVar12 = CONCAT44(0,uVar11);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar12;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar10;
    uVar8 = SUB168(auVar5 / auVar4,0);
    if (uVar8 >> 0x20 == 0) {
      (this->reg).sr.n = 0x7fffffff < uVar8;
      (this->reg).sr.z = uVar10 < uVar12;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
    }
    else {
      (this->reg).sr.v = true;
    }
    if ((this->reg).sr.v != false) {
      return true;
    }
    *(int *)((long)&(this->reg).field_3 + uVar14 * 4) = (int)(uVar10 % uVar12);
    *(int *)((long)&(this->reg).field_3 + uVar13 * 4) = SUB164(auVar5 / auVar4,0);
    return true;
  case 2:
    iVar3 = *(int *)((long)&(this->reg).field_3 + uVar13 * 4);
    uVar8 = (long)iVar3 / (long)(int)uVar11;
    iVar7 = (int)uVar8;
    (this->reg).sr.n = (bool)((byte)(uVar8 >> 0x1f) & 1);
    (this->reg).sr.z = iVar7 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    *(int *)((long)&(this->reg).field_3 + uVar14 * 4) = iVar3 % (int)uVar11;
    *(int *)((long)&(this->reg).field_3 + uVar13 * 4) = iVar7;
    break;
  case 3:
    pVar9 = divlsMusashi<4>(this,CONCAT44(*(undefined4 *)((long)&(this->reg).field_3 + uVar14 * 4),
                                          *(undefined4 *)((long)&(this->reg).field_3 + uVar13 * 4)),
                            uVar11);
    if ((this->reg).sr.v != false) {
      return true;
    }
    *(uint *)((long)&(this->reg).field_3 + uVar14 * 4) = pVar9.second;
    *(uint *)((long)&(this->reg).field_3 + uVar13 * 4) = pVar9.first;
    return true;
  }
  return true;
}

Assistant:

bool
Moira::execDivlMusashi(u16 opcode, bool *divByZero)
{
    u64 dividend;
    u32 ea, divisor;
    u16 ext = (u16)readI<C, Word>();

    int src = _____________xxx(opcode);
    int dh  = _____________xxx(ext);
    int dl  = _xxx____________(ext);

    try {
        readOp<C, M, S>(src, &ea, &divisor);
    } catch(...) {
        // TODO: Change return type from bool to void
        return false;
    }

    if (divisor == 0) {

        execException<C>(M68kException::DIVIDE_BY_ZERO);
        *divByZero = true;
        return false;
    }

    prefetch<C, POLL>();

    switch (____xx__________(ext)) {

        case 0b00:
        {
            dividend = readD(dl);

            auto result = divluMusashi<Word>(dividend, divisor);
            writeD(dh, result.second);
            writeD(dl, result.first);
            break;
        }
        case 0b01:
        {
            dividend = (u64)readD(dh) << 32 | readD(dl);
            auto result = divluMusashi<Long>(dividend, divisor);
            if(!reg.sr.v) {

                writeD(dh, result.second);
                writeD(dl, result.first);
            }
            break;
        }
        case 0b10:
        {
            dividend = readD(dl);
            auto result = divlsMusashi<Word>(dividend, divisor);
            writeD(dh, result.second);
            writeD(dl, result.first);
            break;
        }
        case 0b11:
        {
            dividend = (u64)readD(dh) << 32 | readD(dl);
            auto result = divlsMusashi<Long>(dividend, divisor);

            if(!reg.sr.v) {

                writeD(dh, result.second);
                writeD(dl, result.first);
            }
            break;
        }
    }

    return true;
}